

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::NonStandardLayout,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout,int>>>const&>
::
UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<std::pair<phmap::priv::NonStandardLayout_const,int>const*,std::vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>>>
          (UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::NonStandardLayout,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout,int>>>const&>
           *this,Flags matcher_flags,
          __normal_iterator<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
          first,__normal_iterator<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
                last)

{
  long lVar1;
  Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *m;
  long lVar2;
  MatcherBase<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> local_48;
  
  *(Flags *)(this + 8) = matcher_flags;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined ***)this = &PTR__UnorderedElementsAreMatcherImpl_00339fd0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  if (first._M_current != last._M_current) {
    do {
      MatcherCastImpl<const_std::pair<phmap::priv::NonStandardLayout,_int>_&,_std::pair<const_phmap::priv::NonStandardLayout,_int>_>
      ::CastImpl(&local_48,first._M_current);
      std::
      vector<testing::Matcher<std::pair<phmap::priv::NonStandardLayout,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::NonStandardLayout,int>const&>>>
      ::emplace_back<testing::Matcher<std::pair<phmap::priv::NonStandardLayout,int>const&>>
                ((vector<testing::Matcher<std::pair<phmap::priv::NonStandardLayout,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::NonStandardLayout,int>const&>>>
                  *)(this + 0x28),
                 (Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *)&local_48);
      MatcherBase<const_std::pair<phmap::priv::NonStandardLayout,_int>_&>::~MatcherBase(&local_48);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
    lVar1 = *(long *)(this + 0x30);
    for (lVar2 = *(long *)(this + 0x28); lVar2 != lVar1; lVar2 = lVar2 + 0x18) {
      if (*(long *)(lVar2 + 8) == 0) {
        local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0
        ;
      }
      else {
        local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
             (_func_int **)(**(code **)(*(long *)(lVar2 + 8) + 0x10))(lVar2);
      }
      std::
      vector<testing::MatcherDescriberInterface_const*,std::allocator<testing::MatcherDescriberInterface_const*>>
      ::emplace_back<testing::MatcherDescriberInterface_const*>
                ((vector<testing::MatcherDescriberInterface_const*,std::allocator<testing::MatcherDescriberInterface_const*>>
                  *)(this + 0x10),(MatcherDescriberInterface **)&local_48);
    }
  }
  return;
}

Assistant:

UnorderedElementsAreMatcherImpl(UnorderedMatcherRequire::Flags matcher_flags,
                                  InputIter first, InputIter last)
      : UnorderedElementsAreMatcherImplBase(matcher_flags) {
    for (; first != last; ++first) {
      matchers_.push_back(MatcherCast<const Element&>(*first));
    }
    for (const auto& m : matchers_) {
      matcher_describers().push_back(m.GetDescriber());
    }
  }